

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O2

Parse * __thiscall
trieste::Parse::gen(Parse *this,
                   initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
                   g)

{
  mapped_type *this_00;
  iterator __k;
  long lVar1;
  const_iterator __begin2;
  
  __k = g._M_array;
  for (lVar1 = g._M_len * 0x28; lVar1 != 0; lVar1 = lVar1 + -0x28) {
    this_00 = std::
              map<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>_>
              ::operator[](&this->gens,&__k->first);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
    ::operator=(this_00,&__k->second);
    __k = __k + 1;
  }
  return this;
}

Assistant:

Parse& gen(std::initializer_list<std::pair<Token, GenLocationF>> g)
    {
      for (auto& [type, f] : g)
        gens[type] = f;

      return *this;
    }